

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcRailing::~IfcRailing(IfcRailing *this)

{
  long *plVar1;
  long lVar2;
  
  lVar2 = *(long *)(*(long *)this + -0x18);
  plVar1 = (long *)(&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRailing,_1UL>).field_0x20
                   + lVar2);
  plVar1[-0x2d] = 0x8503d8;
  plVar1[3] = 0x8504f0;
  plVar1[-0x1c] = 0x850400;
  plVar1[-0x1a] = 0x850428;
  plVar1[-0x13] = 0x850450;
  plVar1[-0xd] = 0x850478;
  plVar1[-6] = 0x8504a0;
  plVar1[-4] = 0x8504c8;
  if ((long *)plVar1[-2] != plVar1) {
    operator_delete((long *)plVar1[-2],*plVar1 + 1);
  }
  IfcElement::~IfcElement
            ((IfcElement *)(&this->field_0x0 + lVar2),&PTR_construction_vtable_24__00850510);
  return;
}

Assistant:

IfcRailing() : Object("IfcRailing") {}